

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenParam
          (CppGenerator *this,FieldDef *field,bool direct,char *prefix)

{
  CodeWriter *this_00;
  BaseType BVar1;
  StructDef *def;
  bool bVar2;
  string *psVar3;
  Type *this_01;
  allocator<char> local_e9;
  Type vtype;
  string type;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vtype,"PRE",(allocator<char> *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&type,prefix,(allocator<char> *)&local_88);
  this_00 = &this->code_;
  CodeWriter::SetValue(this_00,(string *)&vtype,&type);
  std::__cxx11::string::~string((string *)&type);
  std::__cxx11::string::~string((string *)&vtype);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vtype,"PARAM_NAME",(allocator<char> *)&local_a8);
  Name_abi_cxx11_(&type,this,field);
  CodeWriter::SetValue(this_00,(string *)&vtype,&type);
  std::__cxx11::string::~string((string *)&type);
  std::__cxx11::string::~string((string *)&vtype);
  if (direct) {
    BVar1 = (field->value).type.base_type;
    if ((BVar1 == BASE_TYPE_VECTOR64) || (BVar1 == BASE_TYPE_VECTOR)) {
      vtype.base_type = (field->value).type.element;
      def = (field->value).type.struct_def;
      vtype.enum_def = (field->value).type.enum_def;
      vtype.fixed_length = (field->value).type.fixed_length;
      vtype.element = BASE_TYPE_NONE;
      type._M_dataplus._M_p = (pointer)&type.field_2;
      type._M_string_length = 0;
      type.field_2._M_local_buf[0] = '\0';
      vtype.struct_def = def;
      if ((vtype.base_type == BASE_TYPE_STRUCT) && (def->fixed == true)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"",(allocator<char> *)&local_68);
        BaseGenerator::WrapInNameSpace
                  (&local_a8,&this->super_BaseGenerator,&def->super_Definition,&local_88);
        std::__cxx11::string::operator=((string *)&type,(string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        psVar3 = &local_88;
      }
      else {
        bVar2 = VectorElementUserFacing(this,&vtype);
        GenTypeWire_abi_cxx11_(&local_a8,this,&vtype,"",bVar2,field->offset64);
        psVar3 = &local_a8;
        std::__cxx11::string::operator=((string *)&type,(string *)psVar3);
      }
      std::__cxx11::string::~string((string *)psVar3);
      bVar2 = TypeHasKey(this,&vtype);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,"PARAM_TYPE",&local_e9);
        std::operator+(&local_68,"std::vector<",&type);
        std::operator+(&local_88,&local_68,"> *");
        CodeWriter::SetValue(this_00,&local_a8,&local_88);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,"PARAM_TYPE",&local_e9);
        std::operator+(&local_68,"const std::vector<",&type);
        std::operator+(&local_88,&local_68,"> *");
        CodeWriter::SetValue(this_00,&local_a8,&local_88);
      }
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"PARAM_VALUE",(allocator<char> *)&local_68);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"nullptr",&local_e9);
      CodeWriter::SetValue(this_00,&local_a8,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      this_01 = (Type *)&type;
      goto LAB_0016b6e7;
    }
    if (BVar1 != BASE_TYPE_STRING) goto LAB_0016b389;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vtype,"PARAM_TYPE",(allocator<char> *)&local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type,"const char *",(allocator<char> *)&local_88);
    CodeWriter::SetValue(this_00,(string *)&vtype,&type);
    std::__cxx11::string::~string((string *)&type);
    std::__cxx11::string::~string((string *)&vtype);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vtype,"PARAM_VALUE",(allocator<char> *)&local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type,"nullptr",(allocator<char> *)&local_88);
    CodeWriter::SetValue(this_00,(string *)&vtype,&type);
LAB_0016b4a0:
    psVar3 = &type;
  }
  else {
LAB_0016b389:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vtype,"PARAM_VALUE",(allocator<char> *)&local_a8);
    GetDefaultScalarValue_abi_cxx11_(&type,this,field,false);
    CodeWriter::SetValue(this_00,(string *)&vtype,&type);
    std::__cxx11::string::~string((string *)&type);
    std::__cxx11::string::~string((string *)&vtype);
    if ((0xb < (field->value).type.base_type - BASE_TYPE_UTYPE) || (field->presence != kOptional)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vtype,"PARAM_TYPE",(allocator<char> *)&local_a8);
      GenTypeWire_abi_cxx11_(&type,this,&(field->value).type," ",true,field->offset64);
      CodeWriter::SetValue(this_00,(string *)&vtype,&type);
      goto LAB_0016b4a0;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vtype,"PARAM_TYPE",(allocator<char> *)&local_88);
    GenOptionalDecl_abi_cxx11_(&local_a8,this,&(field->value).type);
    std::operator+(&type,&local_a8," ");
    CodeWriter::SetValue(this_00,(string *)&vtype,&type);
    std::__cxx11::string::~string((string *)&type);
    psVar3 = &local_a8;
  }
  std::__cxx11::string::~string((string *)psVar3);
  this_01 = &vtype;
LAB_0016b6e7:
  std::__cxx11::string::~string((string *)this_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"{{PRE}}{{PARAM_TYPE}}{{PARAM_NAME}} = {{PARAM_VALUE}}\\",
             (allocator<char> *)&vtype);
  CodeWriter::operator+=(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void GenParam(const FieldDef &field, bool direct, const char *prefix) {
    code_.SetValue("PRE", prefix);
    code_.SetValue("PARAM_NAME", Name(field));
    if (direct && IsString(field.value.type)) {
      code_.SetValue("PARAM_TYPE", "const char *");
      code_.SetValue("PARAM_VALUE", "nullptr");
    } else if (direct && IsVector(field.value.type)) {
      const auto vtype = field.value.type.VectorType();
      std::string type;
      if (IsStruct(vtype)) {
        type = WrapInNameSpace(*vtype.struct_def);
      } else {
        type = GenTypeWire(vtype, "", VectorElementUserFacing(vtype),
                           field.offset64);
      }
      if (TypeHasKey(vtype)) {
        code_.SetValue("PARAM_TYPE", "std::vector<" + type + "> *");
      } else {
        code_.SetValue("PARAM_TYPE", "const std::vector<" + type + "> *");
      }
      code_.SetValue("PARAM_VALUE", "nullptr");
    } else {
      const auto &type = field.value.type;
      code_.SetValue("PARAM_VALUE", GetDefaultScalarValue(field, false));
      if (field.IsScalarOptional())
        code_.SetValue("PARAM_TYPE", GenOptionalDecl(type) + " ");
      else
        code_.SetValue("PARAM_TYPE",
                       GenTypeWire(type, " ", true, field.offset64));
    }
    code_ += "{{PRE}}{{PARAM_TYPE}}{{PARAM_NAME}} = {{PARAM_VALUE}}\\";
  }